

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O0

void Msat_IntVecSort(Msat_IntVec_t *p,int fReverse)

{
  int fReverse_local;
  Msat_IntVec_t *p_local;
  
  if (fReverse == 0) {
    qsort(p->pArray,(long)p->nSize,4,Msat_IntVecSortCompare1);
  }
  else {
    qsort(p->pArray,(long)p->nSize,4,Msat_IntVecSortCompare2);
  }
  return;
}

Assistant:

void Msat_IntVecSort( Msat_IntVec_t * p, int fReverse )
{
    if ( fReverse ) 
        qsort( (void *)p->pArray, p->nSize, sizeof(int), 
                (int (*)(const void *, const void *)) Msat_IntVecSortCompare2 );
    else
        qsort( (void *)p->pArray, p->nSize, sizeof(int), 
                (int (*)(const void *, const void *)) Msat_IntVecSortCompare1 );
}